

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.hpp
# Opt level: O1

void __thiscall
duckdb::Deserializer::ReadPropertyWithDefault<duckdb::vector<duckdb::ColumnIndex,true>>
          (Deserializer *this,field_id_t field_id,char *tag,vector<duckdb::ColumnIndex,_true> *ret)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined6 in_register_00000032;
  long lVar3;
  ColumnIndex val;
  vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_> local_78;
  ColumnIndex local_58;
  
  iVar1 = (*this->_vptr_Deserializer[4])(this,CONCAT62(in_register_00000032,field_id));
  if ((byte)iVar1 == 0) {
    local_58.index =
         (idx_t)(ret->super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>).
                super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
                _M_impl.super__Vector_impl_data._M_start;
    local_58.child_indexes.super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
    super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
    super__Vector_impl_data._M_start =
         (ret->super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>).
         super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_58.child_indexes.super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
    super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (ret->super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>).
         super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    (ret->super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>).
    super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (ret->super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>).
    super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (ret->super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>).
    super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_78.super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_78.super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_78.super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ::std::vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>::~vector
              ((vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_> *)&local_58);
    ::std::vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>::~vector(&local_78);
  }
  else {
    local_78.super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_78.super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_78.super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    iVar2 = (*this->_vptr_Deserializer[8])(this);
    lVar3 = CONCAT44(extraout_var,iVar2);
    if (lVar3 != 0) {
      do {
        (*this->_vptr_Deserializer[6])(this);
        ColumnIndex::Deserialize(&local_58,this);
        (*this->_vptr_Deserializer[7])(this);
        ::std::vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>::
        emplace_back<duckdb::ColumnIndex>(&local_78,&local_58);
        ::std::vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>::~vector
                  (&local_58.child_indexes.
                    super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>);
        lVar3 = lVar3 + -1;
      } while (lVar3 != 0);
    }
    (*this->_vptr_Deserializer[9])(this);
    local_58.index =
         (idx_t)(ret->super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>).
                super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
                _M_impl.super__Vector_impl_data._M_start;
    local_58.child_indexes.super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
    super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
    super__Vector_impl_data._M_start =
         (ret->super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>).
         super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_58.child_indexes.super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
    super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (ret->super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>).
         super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    (ret->super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>).
    super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_78.super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
         _M_impl.super__Vector_impl_data._M_start;
    (ret->super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>).
    super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_78.super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    (ret->super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>).
    super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_78.super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_78.super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_78.super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_78.super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ::std::vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>::~vector
              ((vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_> *)&local_58);
    ::std::vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>::~vector(&local_78);
  }
  (*this->_vptr_Deserializer[5])(this,(ulong)(byte)iVar1);
  return;
}

Assistant:

inline void ReadPropertyWithDefault(const field_id_t field_id, const char *tag, T &ret) {
		if (!OnOptionalPropertyBegin(field_id, tag)) {
			ret = std::forward<T>(SerializationDefaultValue::GetDefault<T>());
			OnOptionalPropertyEnd(false);
			return;
		}
		ret = Read<T>();
		OnOptionalPropertyEnd(true);
	}